

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O3

void __thiscall level_mesh::create_models(level_mesh *this)

{
  float fVar1;
  undefined8 uVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer ppbVar7;
  b_model_instance *pbVar8;
  pointer p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  pointer p_Var13;
  size_t sVar14;
  pointer ppbVar15;
  pointer p_Var16;
  pointer p_Var17;
  b_submesh_vec submeshes;
  b_submesh_vec fake_submeshes;
  b_submesh_vec mu_submeshes;
  b_submesh_vec local_88;
  b_submesh_vec local_68;
  b_submesh_vec local_48;
  
  pbVar3 = (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pbVar4 = (this->m_mu_instances).super__Vector_base<b_mu_instance,_std::allocator<b_mu_instance>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar6 = (this->m_mu_instances).super__Vector_base<b_mu_instance,_std::allocator<b_mu_instance>_>.
           _M_impl.super__Vector_impl_data._M_start;
  xray_re::msg("building edge-connected submeshes");
  local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar14 = create_submeshes(this,&local_48,&local_68,&local_88);
  xray_re::msg("submeshes (MU): %Iu",
               (long)local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
  xray_re::msg("submeshes (fake): %Iu",
               (long)local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
  xray_re::msg("submeshes (regular): %Iu",
               (long)local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
  xray_re::msg("reordering faces");
  reorder_faces(this);
  xray_re::msg("accounting submeshes");
  account_submeshes(this,&local_48,&local_68,&local_88);
  xray_re::msg("creating collision models (MU)");
  setup_collision_models(this,&local_48);
  xray_re::msg("creating collision models (fake)");
  setup_collision_models(this,&local_68);
  merge_mu_fake_submeshes(this,&local_48,&local_68,&local_88);
  xray_re::msg("creating collision models (regular)");
  setup_collision_models(this,&local_88);
  merge_regular_submeshes(this,&local_88,sVar14 + ((long)pbVar3 - (long)pbVar5 >> 4));
  if (this->m_debug_merge == false) {
    p_Var17 = (this->m_fat_points).
              super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    p_Var16 = (this->m_fat_points).
              super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    ppbVar7 = (this->m_instances).
              super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppbVar15 = (this->m_instances).
                    super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppbVar15 != ppbVar7;
        ppbVar15 = ppbVar15 + 1) {
      pbVar8 = *ppbVar15;
      fVar10 = (pbVar8->aabb).field_0.field_1.y1;
      fVar11 = (pbVar8->aabb).field_0.field_1.z1;
      fVar12 = (pbVar8->aabb).field_0.field_1.x2;
      fVar1 = this->m_glue_factor;
      (pbVar8->aabb).field_0.field_1.x1 = (pbVar8->aabb).field_0.field_1.x1 - fVar1;
      (pbVar8->aabb).field_0.field_1.y1 = fVar10 - fVar1;
      (pbVar8->aabb).field_0.field_1.z1 = fVar11 - fVar1;
      (pbVar8->aabb).field_0.field_1.x2 = fVar12 + fVar1;
      uVar2 = *(undefined8 *)((long)&(pbVar8->aabb).field_0 + 0x10);
      *(ulong *)((long)&(pbVar8->aabb).field_0 + 0x10) =
           CONCAT44((float)((ulong)uVar2 >> 0x20) + fVar1,(float)uVar2 + fVar1);
    }
    p_Var17 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
              super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    p_Var9 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
             super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    p_Var16 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
              super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    p_Var13 = (this->m_fat_points).
              super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->super_xr_mesh_builder).super_xr_mesh.m_points.
    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl
    .super__Vector_impl_data._M_start =
         (this->m_fat_points).
         super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->super_xr_mesh_builder).super_xr_mesh.m_points.
    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl
    .super__Vector_impl_data._M_finish = p_Var13;
    (this->super_xr_mesh_builder).super_xr_mesh.m_points.
    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (this->m_fat_points).
         super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_fat_points).
    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl
    .super__Vector_impl_data._M_start = p_Var17;
    (this->m_fat_points).
    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl
    .super__Vector_impl_data._M_finish = p_Var9;
    (this->m_fat_points).
    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = p_Var16;
  }
  (this->m_fat_points).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fat_points).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fat_points).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (p_Var17 != (pointer)0x0) {
    operator_delete(p_Var17,(long)p_Var16 - (long)p_Var17);
  }
  validate_instances_order(this);
  pre_commit(this);
  collect_mu_models(this,((long)pbVar4 - (long)pbVar6 >> 2) * -0xf0f0f0f0f0f0f0f);
  lock_models(this);
  if (local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void level_mesh::create_models()
{
	size_t num_models_hint = m_models.size(), num_mu_instances = m_mu_instances.size();

	msg("building edge-connected submeshes");
	b_submesh_vec mu_submeshes, fake_submeshes, submeshes;
	num_models_hint += create_submeshes(mu_submeshes, fake_submeshes, submeshes);
	msg("submeshes (MU): %" PRIuSIZET, mu_submeshes.size());
	msg("submeshes (fake): %" PRIuSIZET, fake_submeshes.size());
	msg("submeshes (regular): %" PRIuSIZET, submeshes.size());

	msg("reordering faces");
	reorder_faces();

	msg("accounting submeshes");
	account_submeshes(mu_submeshes, fake_submeshes, submeshes);

#ifdef USE_WIN32_MT
	HANDLE setup_thread = NULL;
	if (m_use_mt) {
		msg("creating collision models (regular) - starting thread");
		setup_thread_param param;
		param.__this = this;
		param.submeshes = &submeshes;
		setup_thread = (HANDLE)_beginthreadex(NULL, 0, &level_mesh::setup_thread_cb, &param, 0, NULL);
		xr_assert(setup_thread != NULL);
	}
#endif
	msg("creating collision models (MU)");
	setup_collision_models(mu_submeshes);
	msg("creating collision models (fake)");
	setup_collision_models(fake_submeshes);

#ifdef USE_WIN32_MT
	if (setup_thread != NULL) {
		b_submesh_vec temp_submeshes;
		merge_mu_fake_submeshes(mu_submeshes, fake_submeshes, temp_submeshes);
		msg("creating collision models (regular) - waiting thread");
		WaitForSingleObject(setup_thread, INFINITE);
		submeshes.insert(submeshes.end(), temp_submeshes.begin(), temp_submeshes.end());
	} else
#endif
	{
		merge_mu_fake_submeshes(mu_submeshes, fake_submeshes, submeshes);
		msg("creating collision models (regular)");
		setup_collision_models(submeshes);
	}
	merge_regular_submeshes(submeshes, num_models_hint);

	if (m_debug_merge) {
		for (b_model_instance_vec_it it = m_instances.begin(),
				end = m_instances.end(); it != end; ++it) {
			(*it)->aabb.grow(m_glue_factor);
		}
		m_points.swap(m_fat_points);
	}
	std::vector<fvector3>().swap(m_fat_points);

	validate_instances_order();

	pre_commit();

	collect_mu_models(num_mu_instances);

	lock_models();
}